

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar.c
# Opt level: O0

int mtar_open_memory(mtar_t *tar,void *data,size_t size)

{
  size_t local_20;
  size_t size_local;
  void *data_local;
  mtar_t *tar_local;
  
  if ((data == (void *)0x0) || (local_20 = size, size_local = (size_t)data, size == 0)) {
    size_local = 0;
    local_20 = 0;
  }
  memset(tar,0,0x60);
  tar->write = memory_write;
  tar->read = memory_read;
  tar->seek = memory_seek;
  tar->close = memory_close;
  tar->stream = (void *)size_local;
  tar->memory = (void *)0x0;
  tar->memory_pos = 0;
  tar->memory_size = local_20;
  tar->memory_capacity = 0;
  return 0;
}

Assistant:

int mtar_open_memory(mtar_t *tar, void *data, size_t size) {
  if (!data || !size) {
    data = NULL;
    size = 0;
  }

  /* Init tar struct and functions */
  memset(tar, 0, sizeof(*tar));
  tar->write = memory_write;
  tar->read = memory_read;
  tar->seek = memory_seek;
  tar->close = memory_close;
  tar->stream = data;   /* for input */
  tar->memory = NULL;   /* for output */
  tar->memory_pos = 0;
  tar->memory_size = size;
  tar->memory_capacity = 0;

  /* Return ok */
  return MTAR_ESUCCESS;
}